

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O2

void __thiscall BindingEnv::~BindingEnv(BindingEnv *this)

{
  ~BindingEnv(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

virtual ~BindingEnv() {}